

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O3

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
          (gemm_pack_rhs<double,_long,_4,_1,_false,_false> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  long j2;
  ulong uVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  
  if (offset != 0 || stride != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hq-jiang[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x4fb,
                  "void Eigen::internal::gemm_pack_rhs<double, long, 4, 1>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 1, Conjugate = false, PanelMode = false]"
                 );
  }
  uVar4 = cols + 3;
  if (-1 < cols) {
    uVar4 = cols;
  }
  uVar1 = uVar4 & 0xfffffffffffffffc;
  if (cols < 4) {
    lVar3 = 0;
  }
  else {
    pdVar2 = rhs + 3;
    lVar3 = 0;
    lVar7 = 0;
    do {
      lVar6 = depth;
      pdVar5 = pdVar2;
      if (0 < depth) {
        do {
          blockB[lVar3] = pdVar5[-3];
          blockB[lVar3 + 1] = pdVar5[-2];
          blockB[lVar3 + 2] = pdVar5[-1];
          blockB[lVar3 + 3] = *pdVar5;
          lVar3 = lVar3 + 4;
          pdVar5 = pdVar5 + rhsStride;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      lVar7 = lVar7 + 4;
      pdVar2 = pdVar2 + 4;
    } while (lVar7 < (long)uVar1);
  }
  if ((long)uVar1 < cols) {
    pdVar2 = rhs + ((long)uVar4 >> 2) * 4;
    do {
      pdVar5 = pdVar2;
      lVar7 = depth;
      if (0 < depth) {
        do {
          blockB[lVar3] = *pdVar5;
          lVar3 = lVar3 + 1;
          pdVar5 = pdVar5 + rhsStride;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      uVar1 = uVar1 + 1;
      pdVar2 = pdVar2 + 1;
    } while (uVar1 != cols);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS ROWMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    for(Index k=0; k<depth; k++)
    {
      const Scalar* b0 = &rhs[k*rhsStride + j2];
                blockB[count+0] = cj(b0[0]);
                blockB[count+1] = cj(b0[1]);
      if(nr==4) blockB[count+2] = cj(b0[2]);
      if(nr==4) blockB[count+3] = cj(b0[3]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }
  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[j2];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k*rhsStride]);
      count += 1;
    }
    if(PanelMode) count += stride-offset-depth;
  }
}